

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall kratos::SynthesizableVisitor::~SynthesizableVisitor(SynthesizableVisitor *this)

{
  pointer ppIVar1;
  
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b23c8;
  ppIVar1 = (this->nodes_).super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar1 != (pointer)0x0) {
    operator_delete(ppIVar1,(long)(this->nodes_).
                                  super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar1
                   );
  }
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b0528;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x60);
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
        if (stmt->has_delay()) {
            nodes_.emplace_back(stmt);
        }
    }